

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O0

void __thiscall RandomizerWorld::load_teleport_trees(RandomizerWorld *this)

{
  WorldTeleportTree *pWVar1;
  bool bVar2;
  uint16_t uVar3;
  const_reference pvVar4;
  pair<WorldTeleportTree_*,_WorldTeleportTree_*> pVar5;
  pair<WorldTeleportTree_*,_WorldTeleportTree_*> local_c0;
  WorldTeleportTree *local_b0;
  WorldTeleportTree *tree_2;
  WorldTeleportTree *tree_1;
  Json *tree_pair_json;
  iterator __end1;
  iterator __begin1;
  Json *__range1;
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  local_40;
  undefined1 local_20 [8];
  Json trees_json;
  RandomizerWorld *this_local;
  
  trees_json.m_value = (json_value)this;
  std::
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::function(&local_40,(nullptr_t)0x0);
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[1918]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)local_20,
             (uchar (*) [1918])
             "[\n    [\n        {\n            \"name\": \"Massan tree\",\n            \"treeMapId\": 512,\n            \"nodeId\": \"route_massan_gumi\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 2 }\n        },\n        {\n            \"name\": \"Tibor tree\",\n            \"treeMapId\": 534,\n            \"nodeId\": \"route_gumi_ryuma\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 3 }\n        }\n    ],\n    [\n        {\n            \"name\": \"Mercator front gate tree\",\n            \"treeMapId\": 539,\n            \"nodeId\": \"route_gumi_ryuma\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 5 }\n        },\n        {\n            \"name\": \"Verla shore tree\",\n            \"treeMapId\": 537,\n            \"nodeId\": \"verla_shore\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 4 }\n        }\n    ],\n    [\n        {\n            \"name\": \"Destel sector tree\",\n            \"treeMapId\": 536,\n            \"nodeId\": \"route_after_destel\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 7 }\n        },\n        {\n            \"name\": \"Lake Shrine sector tree\",\n            \"treeMapId\": 513,\n            \"nodeId\": \"route_lake_shrine\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 6 }\n        }\n    ],\n    [\n        {\n            \"name\": \"Mir Tower sector tree\",\n            \"treeMapId\": 538,\n            \"nodeId\": \"mir_tower_sector\",\n            \"flag\": { \"byte\": \"0x25\", \"bit\": 1 }\n        },\n        {\n            \"name\": \"Mountainous area tree\",\n            \"treeMapId\": 535,\n            \"nodeId\": \"mountainous_area\",\n            \"flag\": { \"byte\": \"0x25\", \"bit\": 0 }\n        }\n    ],\n    [\n        {\n            \"name\": \"Greenmaze entrance tree\",\n            \"treeMapId\": 510,\n            \"nodeId\": \"greenmaze_pre_whistle\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 0 }\n        },\n        {\n            \"name\": \"Greenmaze end tree\",\n            \"treeMapId\": 511,\n            \"nodeId\": \"greenmaze_post_whistle\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 1 }\n        }\n    ]\n]"
             ,&local_40,true,false);
  std::
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function(&local_40);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin((iterator *)&__end1.m_it.primitive_iterator,
          (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *)local_20);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end((iterator *)&tree_pair_json,
        (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         *)local_20);
  while( true ) {
    bVar2 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__end1.m_it.primitive_iterator,
                       (iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&tree_pair_json);
    if (!bVar2) break;
    tree_1 = (WorldTeleportTree *)
             nlohmann::detail::
             iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&__end1.m_it.primitive_iterator);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator[]((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)tree_1,0);
    tree_2 = WorldTeleportTree::from_json(pvVar4);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator[]((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)tree_1,1);
    local_b0 = WorldTeleportTree::from_json(pvVar4);
    pWVar1 = tree_2;
    uVar3 = WorldTeleportTree::map_id(local_b0);
    WorldTeleportTree::paired_map_id(pWVar1,uVar3);
    pWVar1 = local_b0;
    uVar3 = WorldTeleportTree::map_id(tree_2);
    WorldTeleportTree::paired_map_id(pWVar1,uVar3);
    pVar5 = std::make_pair<WorldTeleportTree*&,WorldTeleportTree*&>(&tree_2,&local_b0);
    local_c0 = pVar5;
    std::
    vector<std::pair<WorldTeleportTree*,WorldTeleportTree*>,std::allocator<std::pair<WorldTeleportTree*,WorldTeleportTree*>>>
    ::emplace_back<std::pair<WorldTeleportTree*,WorldTeleportTree*>>
              ((vector<std::pair<WorldTeleportTree*,WorldTeleportTree*>,std::allocator<std::pair<WorldTeleportTree*,WorldTeleportTree*>>>
                *)&this->_teleport_tree_pairs,&local_c0);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&__end1.m_it.primitive_iterator);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_20);
  return;
}

Assistant:

void RandomizerWorld::load_teleport_trees()
{
    Json trees_json = Json::parse(WORLD_TELEPORT_TREES_JSON);
    for(const Json& tree_pair_json : trees_json)
    {
        WorldTeleportTree* tree_1 = WorldTeleportTree::from_json(tree_pair_json[0]);
        WorldTeleportTree* tree_2 = WorldTeleportTree::from_json(tree_pair_json[1]);
        tree_1->paired_map_id(tree_2->map_id());
        tree_2->paired_map_id(tree_1->map_id());
        _teleport_tree_pairs.emplace_back(std::make_pair(tree_1, tree_2));
    }
}